

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINGetNumFuncEvals(void *kinmem,long *nfevals)

{
  KINMem kin_mem;
  long *nfevals_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINGetNumFuncEvals","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else {
    *nfevals = *(long *)((long)kinmem + 0xd0);
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINGetNumFuncEvals(void *kinmem, long int *nfevals)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINGetNumFuncEvals", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;
  *nfevals = nfe;

  return(KIN_SUCCESS);
}